

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O1

void __thiscall Editor::flipTile(Editor *this,bool acrossVertical)

{
  CursorState CVar1;
  _Rb_tree_color _Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  Vector2<int> VVar7;
  tuple<Command_*,_std::default_delete<Command>_> tVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int i;
  uint tileIndex;
  SubBoard *this_00;
  ulong uVar13;
  pair<sf::Vector2<int>,_sf::Vector2<int>_> pVar14;
  unique_ptr<commands::FlipTiles,_std::default_delete<commands::FlipTiles>_> command_1;
  unique_ptr<commands::FlipTiles,_std::default_delete<commands::FlipTiles>_> command;
  bool local_b9;
  Vector2i local_b8;
  undefined1 local_b0 [40];
  undefined1 local_88 [32];
  Vector2<int> local_68;
  _Head_base<0UL,_gui::Theme_*,_false> local_60;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  Chunk *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __uniq_ptr_impl<gui::Theme,_std::default_delete<gui::Theme>_> local_38;
  
  CVar1 = this->cursorState_;
  local_b9 = acrossVertical;
  if (CVar1 == pasteArea) {
    this_00 = &this->copySubBoard_;
  }
  else {
    if (CVar1 != pickTile) {
      if ((CVar1 == empty) && ((this->cursorCoords_).second == true)) {
        pVar14 = Board::getHighlightedBounds(this->board_);
        VVar7 = pVar14.second;
        iVar10 = pVar14.first.x;
        if (pVar14.second.x < iVar10) {
          local_b8 = (Vector2i)((ulong)local_b8 & 0xffffffffffffff00);
          makeCommand<commands::FlipTiles,Board&,bool&,bool>
                    ((Editor *)local_88,(Board *)this,(bool *)this->board_,&local_b9);
          commands::FlipTiles::pushBackTile
                    ((FlipTiles *)local_88._0_8_,&(this->cursorCoords_).first);
          uVar3 = local_88._0_8_;
          local_88._0_8_ = (__uniq_ptr_impl<Command,_std::default_delete<Command>_>)0x0;
          uVar4 = local_88._0_8_;
          local_88._0_4_ = (undefined4)uVar3;
          local_88._4_4_ = SUB84(uVar3,4);
          local_b8.x = local_88._0_4_;
          local_b8.y = local_88._4_4_;
          local_88._0_8_ = uVar4;
          executeCommand(this,(unique_ptr<Command,_std::default_delete<Command>_> *)&local_b8);
          tVar8.super__Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>.
          super__Head_base<0UL,_Command_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)
               (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)local_88._0_8_;
          if (local_b8 != (Vector2i)0x0) {
            (**(code **)(*(long *)local_b8 + 8))();
            tVar8.super__Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>.
            super__Head_base<0UL,_Command_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)
                 (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)local_88._0_8_;
          }
        }
        else {
          local_88[0] = 1;
          local_88._24_8_ = this;
          makeCommand<commands::FlipTiles,Board&,bool&,bool>
                    ((Editor *)local_b0,(Board *)this,(bool *)this->board_,&local_b9);
          local_38._M_t.super__Tuple_impl<0UL,_gui::Theme_*,_std::default_delete<gui::Theme>_>.
          super__Head_base<0UL,_gui::Theme_*,_false>._M_head_impl =
               (tuple<gui::Theme_*,_std::default_delete<gui::Theme>_>)((ulong)pVar14.first >> 0x20);
          uVar11 = pVar14.first.y >> 5;
          local_b0._16_8_ = ZEXT48(uVar11);
          local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)VVar7 >> 0x20);
          local_b0._32_4_ = pVar14.second.y >> 5;
          local_68 = VVar7;
          if ((int)uVar11 <= (int)local_b0._32_4_) {
            local_60._M_head_impl = *(Theme **)(local_88._24_8_ + 0x78);
            local_b0._12_4_ = iVar10 >> 5;
            local_b0._28_4_ = pVar14.second.x >> 5;
            local_b0._36_4_ = local_b0._28_4_;
            if ((int)local_b0._28_4_ < (int)local_b0._12_4_) {
              local_b0._36_4_ = local_b0._12_4_;
            }
            do {
              if ((int)local_b0._12_4_ <= (int)local_b0._28_4_) {
                uVar6 = (uint)local_b0._16_8_;
                local_58 = (element_type *)((ulong)(uVar6 | 0x80000000) << 0x20);
                uVar11 = local_b0._12_4_;
                do {
                  local_48 = Board::accessChunk((Board *)local_60._M_head_impl,
                                                (ulong)(uVar11 | 0x80000000) | (ulong)local_58);
                  uVar13 = 0;
                  local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar11;
                  do {
                    tileIndex = (uint)uVar13;
                    uVar9 = tileIndex & 0x1f | uVar11 << 5;
                    if ((iVar10 <= (int)uVar9) && ((int)uVar9 <= local_68.x)) {
                      iVar12 = (int)(uVar13 >> 5) + uVar6 * 0x20;
                      if (((int)local_38._M_t.
                                super__Tuple_impl<0UL,_gui::Theme_*,_std::default_delete<gui::Theme>_>
                                .super__Head_base<0UL,_gui::Theme_*,_false>._M_head_impl <= iVar12)
                         && (iVar12 <= (int)local_40._M_pi)) {
                        Chunk::accessTile((Tile *)local_88,local_48,tileIndex);
                        bVar5 = Tile::getHighlight((Tile *)local_88);
                        if (bVar5) {
                          local_b8.y = iVar12;
                          local_b8.x = uVar9;
                          commands::FlipTiles::pushBackTile((FlipTiles *)local_b0._0_8_,&local_b8);
                        }
                      }
                    }
                    uVar13 = (ulong)(tileIndex + 1);
                  } while (tileIndex + 1 != 0x400);
                  uVar11 = (uint)local_50._M_pi + 1;
                } while ((uint)local_50._M_pi != local_b0._36_4_);
              }
              _Var2 = (_Rb_tree_color)local_b0._16_8_;
              local_b0._16_8_ = ZEXT48(_Var2 + _S_black);
            } while (_Var2 != local_b0._32_4_);
          }
          local_88._0_8_ = local_b0._0_8_;
          local_b0._0_8_ = (FlipTiles *)0x0;
          executeCommand((Editor *)local_88._24_8_,
                         (unique_ptr<Command,_std::default_delete<Command>_> *)local_88);
          tVar8.super__Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>.
          super__Head_base<0UL,_Command_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)
               (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)local_b0._0_8_;
          if ((__uniq_ptr_impl<Command,_std::default_delete<Command>_>)local_88._0_8_ !=
              (__uniq_ptr_impl<Command,_std::default_delete<Command>_>)0x0) {
            (**(code **)(*(_func_int **)local_88._0_8_ + 8))();
            tVar8.super__Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>.
            super__Head_base<0UL,_Command_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)
                 (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)local_b0._0_8_;
          }
        }
        if (tVar8.super__Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>.
            super__Head_base<0UL,_Command_*,_false>._M_head_impl !=
            (_Head_base<0UL,_Command_*,_false>)0x0) {
          (**(code **)(*(long *)tVar8.
                                super__Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>.
                                super__Head_base<0UL,_Command_*,_false>._M_head_impl + 8))();
        }
      }
      return;
    }
    this_00 = &this->tileSubBoard_;
  }
  SubBoard::flip(this_00,acrossVertical);
  return;
}

Assistant:

void Editor::flipTile(bool acrossVertical) {
    if (cursorState_ == CursorState::empty) {
        if (!cursorCoords_.second) {
            return;
        }
        auto bounds = board_.getHighlightedBounds();
        if (bounds.first.x > bounds.second.x) {
            // Not flipping a selection.
            auto command = makeCommand<commands::FlipTiles>(board_, acrossVertical, false);
            command->pushBackTile(cursorCoords_.first);
            executeCommand(std::move(command));
        } else {
            // Flipping a selection.
            auto command = makeCommand<commands::FlipTiles>(board_, acrossVertical, true);
            forEachTile(board_, bounds.first, bounds.second, [&command](Chunk& chunk, int i, int x, int y) {
                Tile tile = chunk.accessTile(i);
                if (tile.getHighlight()) {
                    command->pushBackTile({x, y});
                }
            });
            executeCommand(std::move(command));
        }
    } else if (cursorState_ == CursorState::pickTile) {
        tileSubBoard_.flip(acrossVertical);
    } else if (cursorState_ == CursorState::pasteArea) {
        copySubBoard_.flip(acrossVertical);
    }
}